

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_TwoLevelShm_Async.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP5Writer::WriteData_TwoLevelShm_Async(BP5Writer *this,BufferV *Data)

{
  rep_conflict rVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint64_t uVar6;
  TokenChain<unsigned_long> *this_00;
  reference puVar7;
  undefined8 *puVar8;
  void *pvVar9;
  BufferV *in_RSI;
  long in_RDI;
  uint64_t nextWriterPos_3;
  uint64_t nextWriterPos_2;
  uint64_t nextWriterPos_1;
  uint64_t nextWriterPos;
  size_t alignment_size;
  unsigned_long s;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  uint64_t maxSize;
  uint64_t myTotalSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> mySizes;
  MPIShmChain *a;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd58;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffd60;
  future<int> *in_stack_fffffffffffffd68;
  AsyncWriteInfo *in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  Comm *in_stack_fffffffffffffd98;
  AsyncWriteInfo **in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  launch in_stack_fffffffffffffddc;
  allocator *in_stack_fffffffffffffdf8;
  vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
  *in_stack_fffffffffffffe00;
  unsigned_long *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe48;
  long local_1a8;
  size_t count;
  unsigned_long *in_stack_fffffffffffffe70;
  Comm *in_stack_fffffffffffffe78;
  Comm *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe90;
  allocator local_149;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  allocator local_121;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_120;
  size_t in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  pointer in_stack_ffffffffffffff18;
  MPIShmChain *in_stack_ffffffffffffff20;
  allocator local_99;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  ulong local_78;
  ulong local_60;
  unsigned_long *local_58;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_50;
  undefined1 *local_48;
  ulong local_40;
  long local_38;
  undefined1 local_30 [24];
  long local_18;
  BufferV *local_10;
  
  count = *(size_t *)(in_RDI + 0x9d8);
  local_10 = in_RSI;
  if (count == 0) {
    local_1a8 = 0;
  }
  else {
    local_1a8 = __dynamic_cast(count,&aggregator::MPIAggregator::typeinfo,
                               &aggregator::MPIShmChain::typeinfo,0);
  }
  local_18 = local_1a8;
  uVar6 = helper::PaddingToAlignOffset
                    (*(uint64_t *)(in_RDI + 0xc18),(ulong)*(uint *)(in_RDI + 0x1a4));
  *(uint64_t *)(in_RDI + 0xc18) = uVar6 + *(long *)(in_RDI + 0xc18);
  this_00 = (TokenChain<unsigned_long> *)(local_18 + 0x20);
  adios2::format::BufferV::Size(local_10);
  helper::Comm::GatherValues<unsigned_long>
            (in_stack_fffffffffffffd98,CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
             ,in_stack_fffffffffffffd8c);
  local_38 = 0;
  local_40 = 0;
  local_48 = local_30;
  local_50._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffd58);
  local_58 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       (in_stack_fffffffffffffd58);
  while (bVar2 = __gnu_cxx::operator!=
                           (in_stack_fffffffffffffd60,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffffd58), bVar2) {
    puVar7 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_50);
    local_60 = *puVar7;
    local_38 = local_60 + local_38;
    if (local_40 < local_60) {
      local_40 = local_60;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_50);
  }
  iVar3 = helper::Comm::Size((Comm *)0xaa1162);
  if (1 < iVar3) {
    local_78 = 0x20;
    if ((*(byte *)(in_RDI + 0x1a8) & 1) != 0) {
      local_78 = (ulong)*(uint *)(in_RDI + 0x1ac);
    }
    aggregator::MPIShmChain::CreateShm
              (in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10
               ,in_stack_ffffffffffffff08);
  }
  if ((*(byte *)(local_18 + 0x30) & 1) != 0) {
    in_stack_fffffffffffffe48 = helper::Comm::Rank((Comm *)0xaa1218);
    if (0 < in_stack_fffffffffffffe48) {
      in_stack_fffffffffffffe38 = (unsigned_long *)(in_RDI + 0xc18);
      in_stack_fffffffffffffe44 = helper::Comm::Rank((Comm *)0xaa1260);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_98,"AggregatorChain token in BP5Writer::WriteData_TwoLevelShm",
                 &local_99);
      in_stack_fffffffffffffd58 = &local_98;
      helper::Comm::Recv<unsigned_long>
                (in_stack_fffffffffffffe80,(unsigned_long *)in_stack_fffffffffffffe78,
                 (size_t)in_stack_fffffffffffffe70,(int)(count >> 0x20),(int)count,
                 in_stack_fffffffffffffe90);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      uVar6 = helper::PaddingToAlignOffset
                        (*(uint64_t *)(in_RDI + 0xc18),(ulong)*(uint *)(in_RDI + 0x1a4));
      *(uint64_t *)(in_RDI + 0xc18) = uVar6 + *(long *)(in_RDI + 0xc18);
    }
    *(undefined8 *)(in_RDI + 0xc10) = *(undefined8 *)(in_RDI + 0xc18);
    iVar4 = helper::Comm::Rank((Comm *)0xaa13b9);
    iVar5 = helper::Comm::Size((Comm *)0xaa13d3);
    if (iVar4 < iVar5 + -1) {
      in_stack_fffffffffffffe00 =
           (vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
            *)(local_18 + 0x78);
      helper::Comm::Rank((Comm *)0xaa1430);
      in_stack_fffffffffffffdf8 = (allocator *)&stack0xffffffffffffff17;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff18,"Chain token in BP5Writer::WriteData",
                 in_stack_fffffffffffffdf8);
      in_stack_fffffffffffffd58 =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff18;
      helper::Comm::Isend<unsigned_long>
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,count,
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffe90);
      helper::Comm::Req::~Req((Req *)0xaa14c6);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
    }
    else {
      iVar4 = helper::Comm::Size((Comm *)0xaa153f);
      if (1 < iVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_120,"Chain token in BP5Writer::WriteData",&local_121);
        in_stack_fffffffffffffd58 = &local_120;
        helper::Comm::Isend<unsigned_long>
                  (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,count,
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffe90);
        helper::Comm::Req::~Req((Req *)0xaa1606);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
      }
    }
    in_stack_fffffffffffffddc = helper::Comm::Rank((Comm *)0xaa167e);
    if (in_stack_fffffffffffffddc == 0) {
      iVar4 = helper::Comm::Size((Comm *)0xaa16a8);
      if (iVar4 < 2) {
        *(long *)(in_RDI + 0xc18) = *(long *)(in_RDI + 0xc10) + local_38;
      }
      else {
        in_stack_fffffffffffffdc8 = (AsyncWriteInfo **)(in_RDI + 0xc18);
        in_stack_fffffffffffffdd4 = helper::Comm::Size((Comm *)0xaa16ea);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_148,"Chain token in BP5Writer::WriteData",&local_149);
        in_stack_fffffffffffffd58 = &local_148;
        helper::Comm::Recv<unsigned_long>
                  (in_stack_fffffffffffffe80,(unsigned_long *)in_stack_fffffffffffffe78,
                   (size_t)in_stack_fffffffffffffe70,(int)(count >> 0x20),(int)count,
                   in_stack_fffffffffffffe90);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
      }
    }
  }
  puVar8 = (undefined8 *)operator_new(0xa0);
  puVar8[0x12] = 0;
  puVar8[0x13] = 0;
  puVar8[0x10] = 0;
  puVar8[0x11] = 0;
  puVar8[0xe] = 0;
  puVar8[0xf] = 0;
  puVar8[0xc] = 0;
  puVar8[0xd] = 0;
  puVar8[10] = 0;
  puVar8[0xb] = 0;
  puVar8[8] = 0;
  puVar8[9] = 0;
  puVar8[6] = 0;
  puVar8[7] = 0;
  puVar8[4] = 0;
  puVar8[5] = 0;
  puVar8[2] = 0;
  puVar8[3] = 0;
  *puVar8 = 0;
  puVar8[1] = 0;
  AsyncWriteInfo::AsyncWriteInfo(in_stack_fffffffffffffd70);
  *(undefined8 **)(in_RDI + 0xd48) = puVar8;
  **(undefined8 **)(in_RDI + 0xd48) = *(undefined8 *)(in_RDI + 0x9d8);
  iVar4 = helper::Comm::Rank((Comm *)0xaa1862);
  *(int *)(*(long *)(in_RDI + 0xd48) + 8) = iVar4;
  iVar4 = helper::Comm::Rank((Comm *)0xaa188f);
  *(int *)(*(long *)(in_RDI + 0xd48) + 0x18) = iVar4;
  iVar4 = helper::Comm::Size((Comm *)0xaa18bc);
  *(int *)(*(long *)(in_RDI + 0xd48) + 0x1c) = iVar4;
  helper::Comm::Comm((Comm *)0xaa18e5);
  helper::Comm::operator=((Comm *)in_stack_fffffffffffffd60,(Comm *)in_stack_fffffffffffffd58);
  helper::Comm::~Comm((Comm *)0xaa1916);
  *(undefined8 *)(*(long *)(in_RDI + 0xd48) + 0x20) = *(undefined8 *)(in_RDI + 0xd00);
  pvVar9 = operator_new(0x20);
  shm::TokenChain<unsigned_long>::TokenChain
            (this_00,(Comm *)CONCAT44(iVar3,in_stack_fffffffffffffe48));
  *(void **)(*(long *)(in_RDI + 0xd48) + 0x28) = pvVar9;
  *(long *)(*(long *)(in_RDI + 0xd48) + 0x30) = in_RDI + 0x680;
  *(BufferV **)(*(long *)(in_RDI + 0xd48) + 0x38) = local_10;
  *(long *)(*(long *)(in_RDI + 0xd48) + 0x58) = in_RDI + 0xd10;
  *(long *)(*(long *)(in_RDI + 0xd48) + 0x98) = in_RDI + 0xd50;
  if ((*(byte *)(local_18 + 0x30) & 1) == 0) {
    in_stack_fffffffffffffd70 =
         (AsyncWriteInfo *)
         shm::TokenChain<unsigned_long>::RecvToken
                   ((TokenChain<unsigned_long> *)in_stack_fffffffffffffd70);
    *(MPIAggregator **)(in_RDI + 0xc10) = in_stack_fffffffffffffd70->aggregator;
    in_stack_fffffffffffffd68 = *(future<int> **)(in_RDI + 0xc10);
    adios2::format::BufferV::Size(local_10);
    shm::TokenChain<unsigned_long>::SendToken
              ((TokenChain<unsigned_long> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38);
  }
  else {
    adios2::format::BufferV::Size(local_10);
    shm::TokenChain<unsigned_long>::SendToken
              ((TokenChain<unsigned_long> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38);
    shm::TokenChain<unsigned_long>::RecvToken
              ((TokenChain<unsigned_long> *)in_stack_fffffffffffffd70);
  }
  *(undefined8 *)(*(long *)(in_RDI + 0xd48) + 0x40) = *(undefined8 *)(in_RDI + 0xc10);
  *(long *)(*(long *)(in_RDI + 0xd48) + 0x48) = local_38;
  rVar1 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)(in_RDI + 0xcf0));
  *(rep_conflict *)(*(long *)(in_RDI + 0xd48) + 0x50) = rVar1;
  if ((*(double *)(in_RDI + 0xd40) <= 0.0) || (*(int *)(in_RDI + 0x1bc) != 2)) {
    if (*(int *)(in_RDI + 0x1bc) == 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0xd48) + 0x50) = 0;
    }
    *(undefined8 *)(*(long *)(in_RDI + 0xd48) + 0x60) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0xd48) + 0x68) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0xd48) + 0x88) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0xd48) + 0x90) = 0;
  }
  else {
    *(long *)(*(long *)(in_RDI + 0xd48) + 0x60) = in_RDI + 0xd11;
    *(undefined8 *)(*(long *)(in_RDI + 0xd48) + 0x68) = *(undefined8 *)(in_RDI + 0xd40);
    if (*(double *)(*(long *)(in_RDI + 0xd48) + 0x50) < *(double *)(in_RDI + 0xd40)) {
      *(undefined8 *)(*(long *)(in_RDI + 0xd48) + 0x50) = *(undefined8 *)(in_RDI + 0xd40);
    }
    std::
    vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
    ::operator=(in_stack_fffffffffffffe00,
                (vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
                 *)in_stack_fffffffffffffdf8);
    *(long *)(*(long *)(in_RDI + 0xd48) + 0x88) = in_RDI + 0xd28;
    *(long *)(*(long *)(in_RDI + 0xd48) + 0x90) = in_RDI + 0xd20;
    std::
    vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
    ::clear((vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
             *)0xaa1c93);
    *(undefined8 *)(in_RDI + 0xd40) = 0;
    *(undefined8 *)(in_RDI + 0xd20) = 0;
  }
  std::
  async<int(&)(adios2::core::engine::BP5Writer::AsyncWriteInfo*),adios2::core::engine::BP5Writer::AsyncWriteInfo*&>
            (in_stack_fffffffffffffddc,
             (_func_int_AsyncWriteInfo_ptr *)
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),in_stack_fffffffffffffdc8
            );
  std::future<int>::operator=((future<int> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::future<int>::~future((future<int> *)0xaa1d78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd70);
  return;
}

Assistant:

void BP5Writer::WriteData_TwoLevelShm_Async(format::BufferV *Data)
{
    aggregator::MPIShmChain *a = dynamic_cast<aggregator::MPIShmChain *>(m_Aggregator);

    // new step writing starts at offset m_DataPos on master aggregator
    // other aggregators to the same file will need to wait for the position
    // to arrive from the rank below

    // align to PAGE_SIZE (only valid on master aggregator at this point)
    m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);

    // Each aggregator needs to know the total size they write
    // This calculation is valid on aggregators only
    std::vector<uint64_t> mySizes = a->m_Comm.GatherValues(Data->Size());
    uint64_t myTotalSize = 0;
    uint64_t maxSize = 0;
    for (auto s : mySizes)
    {
        myTotalSize += s;
        if (s > maxSize)
        {
            maxSize = s;
        }
    }

    if (a->m_Comm.Size() > 1)
    {
        size_t alignment_size = sizeof(max_align_t);
        if (m_Parameters.DirectIO)
        {
            alignment_size = m_Parameters.DirectIOAlignOffset;
        }
        a->CreateShm(static_cast<size_t>(maxSize), m_Parameters.MaxShmSize, alignment_size);
    }

    if (a->m_IsAggregator)
    {
        // In each aggregator chain, send from master down the line
        // these total sizes, so every aggregator knows where to start
        if (a->m_AggregatorChainComm.Rank() > 0)
        {
            a->m_AggregatorChainComm.Recv(
                &m_DataPos, 1, a->m_AggregatorChainComm.Rank() - 1, 0,
                "AggregatorChain token in BP5Writer::WriteData_TwoLevelShm");
            // align to PAGE_SIZE
            m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);
        }
        m_StartDataPos = m_DataPos; // metadata needs this info
        if (a->m_AggregatorChainComm.Rank() < a->m_AggregatorChainComm.Size() - 1)
        {
            uint64_t nextWriterPos = m_DataPos + myTotalSize;
            a->m_AggregatorChainComm.Isend(&nextWriterPos, 1, a->m_AggregatorChainComm.Rank() + 1,
                                           0, "Chain token in BP5Writer::WriteData");
        }
        else if (a->m_AggregatorChainComm.Size() > 1)
        {
            // send back final position from last aggregator in file to master
            // aggregator
            uint64_t nextWriterPos = m_DataPos + myTotalSize;
            a->m_AggregatorChainComm.Isend(&nextWriterPos, 1, 0, 0,
                                           "Chain token in BP5Writer::WriteData");
        }

        // Master aggregator needs to know where the last writing ended by the
        // last aggregator in the chain, so that it can start from the correct
        // position at the next output step
        if (!a->m_AggregatorChainComm.Rank())
        {
            if (a->m_AggregatorChainComm.Size() > 1)
            {
                a->m_AggregatorChainComm.Recv(&m_DataPos, 1, a->m_AggregatorChainComm.Size() - 1, 0,
                                              "Chain token in BP5Writer::WriteData");
            }
            else
            {
                m_DataPos = m_StartDataPos + myTotalSize;
            }
        }
    }

    /*std::cout << "Rank " << m_Comm.Rank() << "  start data async "
              << " to subfile " << a->m_SubStreamIndex << " at pos "
              << m_StartDataPos << std::endl;*/

    m_AsyncWriteInfo = new AsyncWriteInfo();
    m_AsyncWriteInfo->aggregator = m_Aggregator;
    m_AsyncWriteInfo->rank_global = m_Comm.Rank();
    m_AsyncWriteInfo->rank_chain = a->m_Comm.Rank();
    m_AsyncWriteInfo->nproc_chain = a->m_Comm.Size();
    m_AsyncWriteInfo->comm_chain = helper::Comm(); // unused in this aggregation
    m_AsyncWriteInfo->tstart = m_EngineStart;
    m_AsyncWriteInfo->tokenChain = new shm::TokenChain<uint64_t>(&a->m_Comm);
    m_AsyncWriteInfo->tm = &m_FileDataManager;
    m_AsyncWriteInfo->Data = Data;
    m_AsyncWriteInfo->flagRush = &m_flagRush;
    m_AsyncWriteInfo->lock = &m_AsyncWriteLock;

    // Metadata collection needs m_StartDataPos correctly set on
    // every process before we call the async writing thread
    if (a->m_IsAggregator)
    {
        // Informs next process its starting offset (for correct metadata)
        uint64_t nextWriterPos = m_StartDataPos + Data->Size();
        m_AsyncWriteInfo->tokenChain->SendToken(nextWriterPos);
        m_AsyncWriteInfo->tokenChain->RecvToken();
    }
    else
    {
        // non-aggregators fill shared buffer in marching order
        // they also receive their starting offset this way
        m_StartDataPos = m_AsyncWriteInfo->tokenChain->RecvToken();
        uint64_t nextWriterPos = m_StartDataPos + Data->Size();
        m_AsyncWriteInfo->tokenChain->SendToken(nextWriterPos);
    }

    // Launch data writing thread, m_StartDataPos is valid
    // m_DataPos is already pointing to the end of the write, do not use here.
    m_AsyncWriteInfo->startPos = m_StartDataPos;
    m_AsyncWriteInfo->totalSize = myTotalSize;
    m_AsyncWriteInfo->deadline = m_ExpectedTimeBetweenSteps.count();

    if (m_ComputationBlocksLength > 0.0 && m_Parameters.AsyncWrite == (int)AsyncWrite::Guided)
    {
        m_AsyncWriteInfo->inComputationBlock = &m_InComputationBlock;
        m_AsyncWriteInfo->computationBlocksLength = m_ComputationBlocksLength;
        if (m_AsyncWriteInfo->deadline < m_ComputationBlocksLength)
        {
            m_AsyncWriteInfo->deadline = m_ComputationBlocksLength;
        }
        m_AsyncWriteInfo->expectedComputationBlocks = m_ComputationBlockTimes; // copy!
        m_AsyncWriteInfo->currentComputationBlocks = &m_ComputationBlockTimes; // ptr!
        m_AsyncWriteInfo->currentComputationBlockID = &m_ComputationBlockID;

        /* Clear current block tracker now so that async thread does not get
        confused with the past info */
        m_ComputationBlockTimes.clear();
        m_ComputationBlocksLength = 0.0;
        m_ComputationBlockID = 0;
    }
    else
    {
        if (m_Parameters.AsyncWrite == (int)AsyncWrite::Naive)
        {
            m_AsyncWriteInfo->deadline = 0;
        }
        m_AsyncWriteInfo->inComputationBlock = nullptr;
        m_AsyncWriteInfo->computationBlocksLength = 0.0;
        m_AsyncWriteInfo->currentComputationBlocks = nullptr;
        m_AsyncWriteInfo->currentComputationBlockID = nullptr;
    }

    m_WriteFuture = std::async(std::launch::async, AsyncWriteThread_TwoLevelShm, m_AsyncWriteInfo);

    /* At this point it is prohibited in the main thread
       - to modify Data, which will be deleted in the async thread any tiume
       - to use m_FileDataManager until next BeginStep, which is being used
         in the async thread to write data
    */
}